

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_util.cpp
# Opt level: O1

void duckdb::regexp_util::ParseRegexOptions
               (ClientContext *context,Expression *expr,Options *target,bool *global_replace)

{
  int iVar1;
  string *options;
  ParameterNotResolvedException *this;
  InvalidInputException *pIVar2;
  Value options_str;
  string local_90;
  Value local_70;
  
  iVar1 = (*(expr->super_BaseExpression)._vptr_BaseExpression[6])(expr);
  if ((char)iVar1 != '\0') {
    this = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this);
    __cxa_throw(this,&ParameterNotResolvedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar1 = (*(expr->super_BaseExpression)._vptr_BaseExpression[0xf])(expr);
  if ((char)iVar1 == '\0') {
    pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_70.type_._0_8_ = (long)&local_70 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Regex options field must be a constant","");
    InvalidInputException::InvalidInputException(pIVar2,(string *)&local_70);
    __cxa_throw(pIVar2,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ExpressionExecutor::EvaluateScalar(&local_70,context,expr,false);
  if (local_70.is_null == true) {
    pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Regex options field must not be NULL","");
    InvalidInputException::InvalidInputException(pIVar2,&local_90);
    __cxa_throw(pIVar2,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((string)local_70.type_.id_ == (string)0x19) {
    options = StringValue::Get_abi_cxx11_(&local_70);
    ParseRegexOptions(options,target,global_replace);
    Value::~Value(&local_70);
    return;
  }
  pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Regex options field must be a string","");
  InvalidInputException::InvalidInputException(pIVar2,&local_90);
  __cxa_throw(pIVar2,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ParseRegexOptions(ClientContext &context, Expression &expr, RE2::Options &target, bool *global_replace) {
	if (expr.HasParameter()) {
		throw ParameterNotResolvedException();
	}
	if (!expr.IsFoldable()) {
		throw InvalidInputException("Regex options field must be a constant");
	}
	Value options_str = ExpressionExecutor::EvaluateScalar(context, expr);
	if (options_str.IsNull()) {
		throw InvalidInputException("Regex options field must not be NULL");
	}
	if (options_str.type().id() != LogicalTypeId::VARCHAR) {
		throw InvalidInputException("Regex options field must be a string");
	}
	ParseRegexOptions(StringValue::Get(options_str), target, global_replace);
}